

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idastar.hpp
# Opt level: O2

bool __thiscall Idastar<Tiles>::dfs(Idastar<Tiles> *this,State *n,int cost,int pop)

{
  size_t *psVar1;
  uint uVar2;
  int iVar3;
  Tiles *this_00;
  bool bVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  Edge<Tiles> e;
  Edge<Tiles> EStack_58;
  
  iVar3 = n->h + cost;
  if (this->bound < iVar3) {
    if (this->minoob < 0 || iVar3 < this->minoob) {
      this->minoob = iVar3;
    }
  }
  else {
    if (n->h == '\0') {
LAB_00106186:
      std::vector<Tiles::State,_std::allocator<Tiles::State>_>::push_back(&this->path,n);
      return true;
    }
    psVar1 = &(this->super_SearchAlg<Tiles>).expd;
    *psVar1 = *psVar1 + 1;
    lVar5 = (long)n->blank;
    uVar2 = *(uint *)((this->super_SearchAlg<Tiles>).dom + lVar5 * 0x14 + 0x4440);
    uVar6 = 0;
    uVar7 = (ulong)uVar2;
    if ((int)uVar2 < 1) {
      uVar7 = uVar6;
    }
    for (; uVar7 != uVar6; uVar6 = uVar6 + 1) {
      this_00 = (this->super_SearchAlg<Tiles>).dom;
      iVar3 = *(int *)(this_00 + uVar6 * 4 + (long)(char)lVar5 * 0x14 + 0x4444);
      if (iVar3 != pop) {
        psVar1 = &(this->super_SearchAlg<Tiles>).gend;
        *psVar1 = *psVar1 + 1;
        Tiles::apply(&EStack_58,this_00,n,iVar3);
        bVar4 = dfs(this,n,EStack_58.cost + cost,EStack_58.pop);
        n->h = (char)EStack_58.undo.h;
        lVar5 = (long)EStack_58.undo.blank;
        n->tiles[n->blank] = n->tiles[lVar5];
        n->blank = (char)EStack_58.undo.blank;
        if (bVar4) goto LAB_00106186;
      }
    }
  }
  return false;
}

Assistant:

bool dfs(typename D::State &n,  int cost, int pop) {
		int f = cost + this->dom.h(n);

		if (f <= bound && this->dom.isgoal(n)) {
			path.push_back(n);
			return true;
		}

		if (f > bound) {
			if (minoob < 0 || f < minoob)
				minoob = f;
			return false;
		}

		this->expd++;
		int nops = this->dom.nops(n);
		for (int i = 0; i < nops; i++) {
			int op = this->dom.nthop(n, i);
			if (op == pop)
				continue;

			this->gend++;
			Edge<D> e = this->dom.apply(n, op);
			bool goal = dfs(n, e.cost + cost, e.pop);
			this->dom.undo(n, e);
			if (goal) {
				path.push_back(n);
				return true;
			}
		}

		return false;
	}